

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void leaveblock(FuncState *fs)

{
  int *piVar1;
  byte *pbVar2;
  byte bVar3;
  LexState *ls;
  BlockCnt *pBVar4;
  Dyndata *pDVar5;
  BlockCnt *pBVar6;
  Labeldesc *pLVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  LocVar *pLVar11;
  TString *name;
  long lVar12;
  uint uVar13;
  long lVar14;
  
  ls = fs->ls;
  pBVar4 = fs->bl;
  bVar3 = pBVar4->nactvar;
  iVar8 = reglevel(fs,(uint)bVar3);
  uVar13 = (uint)fs->nactvar;
  piVar1 = &(ls->dyd->actvar).n;
  *piVar1 = *piVar1 + ((uint)bVar3 - (uint)fs->nactvar);
  while (bVar3 < uVar13) {
    uVar13 = uVar13 - 1;
    fs->nactvar = (lu_byte)uVar13;
    pLVar11 = localdebuginfo(fs,uVar13 & 0xff);
    if (pLVar11 != (LocVar *)0x0) {
      pLVar11->endpc = fs->pc;
    }
  }
  if (pBVar4->isloop != '\0') {
    name = luaS_newlstr(ls->L,"break",5);
    iVar9 = createlabel(ls,name,0,0);
    if (iVar9 != 0) goto LAB_0011a432;
  }
  if ((pBVar4->previous != (BlockCnt *)0x0) && (pBVar4->upval != '\0')) {
    luaK_codeABCk(fs,OP_CLOSE,iVar8,0,0,0);
  }
LAB_0011a432:
  fs->freereg = (lu_byte)iVar8;
  pDVar5 = ls->dyd;
  (pDVar5->label).n = pBVar4->firstlabel;
  pBVar6 = pBVar4->previous;
  fs->bl = pBVar6;
  if (pBVar6 == (BlockCnt *)0x0) {
    if (pBVar4->firstgoto < (pDVar5->gt).n) {
      undefgoto(ls,(pDVar5->gt).arr + pBVar4->firstgoto);
    }
  }
  else {
    pDVar5 = fs->ls->dyd;
    lVar12 = (long)pBVar4->firstgoto;
    iVar8 = (pDVar5->gt).n;
    lVar14 = lVar12 * 0x18 + 0x11;
    for (; lVar12 < iVar8; lVar12 = lVar12 + 1) {
      pLVar7 = (pDVar5->gt).arr;
      iVar9 = reglevel(fs,(uint)*(byte *)((long)pLVar7 + lVar14 + -1));
      bVar3 = pBVar4->nactvar;
      iVar10 = reglevel(fs,(uint)bVar3);
      if (iVar10 < iVar9) {
        pbVar2 = (byte *)((long)&pLVar7->name + lVar14);
        *pbVar2 = *pbVar2 | pBVar4->upval;
      }
      *(byte *)((long)pLVar7 + lVar14 + -1) = bVar3;
      lVar14 = lVar14 + 0x18;
    }
  }
  return;
}

Assistant:

static void leaveblock (FuncState *fs) {
  BlockCnt *bl = fs->bl;
  LexState *ls = fs->ls;
  int hasclose = 0;
  int stklevel = reglevel(fs, bl->nactvar);  /* level outside the block */
  removevars(fs, bl->nactvar);  /* remove block locals */
  lua_assert(bl->nactvar == fs->nactvar);  /* back to level on entry */
  if (bl->isloop)  /* has to fix pending breaks? */
    hasclose = createlabel(ls, luaS_newliteral(ls->L, "break"), 0, 0);
  if (!hasclose && bl->previous && bl->upval)  /* still need a 'close'? */
    luaK_codeABC(fs, OP_CLOSE, stklevel, 0, 0);
  fs->freereg = stklevel;  /* free registers */
  ls->dyd->label.n = bl->firstlabel;  /* remove local labels */
  fs->bl = bl->previous;  /* current block now is previous one */
  if (bl->previous)  /* was it a nested block? */
    movegotosout(fs, bl);  /* update pending gotos to enclosing block */
  else {
    if (bl->firstgoto < ls->dyd->gt.n)  /* still pending gotos? */
      undefgoto(ls, &ls->dyd->gt.arr[bl->firstgoto]);  /* error */
  }
}